

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatVariadic.h
# Opt level: O2

void __thiscall llvm::formatv_object_base::format(formatv_object_base *this,raw_ostream *S)

{
  int *piVar1;
  ReplacementItem *R;
  int *piVar2;
  FmtAlign Align;
  FmtAlign local_48;
  
  piVar2 = *(int **)(this + 0x28);
  piVar1 = *(int **)(this + 0x30);
  do {
    if (piVar2 == piVar1) {
      return;
    }
    if (*piVar2 != 0) {
      if (*piVar2 != 2) {
        if (*(ulong *)(piVar2 + 6) < (ulong)(*(long *)(this + 0x18) - *(long *)(this + 0x10) >> 3))
        {
          local_48.Adapter =
               *(format_adapter **)(*(long *)(this + 0x10) + *(ulong *)(piVar2 + 6) * 8);
          local_48.Where = piVar2[10];
          local_48.Amount = *(size_t *)(piVar2 + 8);
          local_48.Fill = (char)piVar2[0xb];
          FmtAlign::format(&local_48,S,*(StringRef *)(piVar2 + 0xc));
          goto LAB_00153003;
        }
      }
      raw_ostream::operator<<(S,*(StringRef *)(piVar2 + 2));
    }
LAB_00153003:
    piVar2 = piVar2 + 0x10;
  } while( true );
}

Assistant:

void format(raw_ostream &S) const {
    for (auto &R : Replacements) {
      if (R.Type == ReplacementType::Empty)
        continue;
      if (R.Type == ReplacementType::Literal) {
        S << R.Spec;
        continue;
      }
      if (R.Index >= Adapters.size()) {
        S << R.Spec;
        continue;
      }

      auto W = Adapters[R.Index];

      FmtAlign Align(*W, R.Where, R.Align, R.Pad);
      Align.format(S, R.Options);
    }
  }